

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O2

void __thiscall cppcms::impl::tcp_cache_service::server::start_accept(server *this)

{
  session *this_00;
  io_service *srv;
  shared_ptr<cppcms::impl::tcp_cache_service::session> s;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_60;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_58;
  intrusive_ptr<cppcms::impl::base_cache> local_50;
  long local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (session *)operator_new(0xe0);
  srv = get_next_io_service(this);
  local_50.p_ = (this->cache_).p_;
  if (local_50.p_ != (base_cache *)0x0) {
    (*(local_50.p_)->_vptr_base_cache[6])();
  }
  std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_38,
               &(this->sessions_).
                super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
              );
  tcp_cache_service::session::session
            (this_00,srv,&local_50,
             (shared_ptr<cppcms::sessions::session_storage_factory> *)&local_38);
  std::__shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::tcp_cache_service::session,void>
            ((__shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2> *)
             &local_48,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_50);
  mfunc_to_event_handler<cppcms::impl::tcp_cache_service::server,cppcms::impl::tcp_cache_service::server*,std::shared_ptr<cppcms::impl::tcp_cache_service::session>,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>
            ((offset_in_server_to_subr)&local_60,(server *)on_accept,
             (shared_ptr<cppcms::impl::tcp_cache_service::session> *)0x0);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
            (&local_58,&local_60);
  booster::aio::acceptor::async_accept((stream_socket *)this,(callback *)(local_48 + 0x98));
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            (&local_58);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            (&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  return;
}

Assistant:

void start_accept()
	{
		booster::shared_ptr<session> s(new session(get_next_io_service(),cache_,sessions_));
		acceptor_.async_accept(s->socket_,mfunc_to_event_handler(&server::on_accept,this,s));
	}